

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bscb(void *parm,int ofs,int len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  bstring ptVar5;
  int iVar6;
  
  iVar1 = **(int **)((long)parm + 8);
  iVar6 = *(int *)((long)parm + 0x10);
  if (*(int *)((long)parm + 0x10) <= iVar1) {
    do {
      iVar3 = iVar6 * 2;
      iVar2 = iVar6 * -2;
      iVar6 = iVar3;
    } while (SBORROW4(iVar1,iVar3) == iVar1 + iVar2 < 0);
    pvVar4 = realloc(*(int **)((long)parm + 8),(long)iVar3 * 8 + 8);
    if (pvVar4 == (void *)0x0) {
      return -1;
    }
    *(void **)((long)parm + 8) = pvVar4;
    *(int *)((long)parm + 0x10) = iVar3;
  }
  ptVar5 = bmidstr(*parm,ofs,len);
  *(bstring *)(*(int **)((long)parm + 8) + (long)**(int **)((long)parm + 8) * 2 + 2) = ptVar5;
  **(int **)((long)parm + 8) = **(int **)((long)parm + 8) + 1;
  return 0;
}

Assistant:

static int bscb (void * parm, int ofs, int len) {
struct genBstrList * g = (struct genBstrList *)parm;
	if (g->bl->qty >= g->mlen) {
		int mlen = g->mlen * 2;
		struct bstrList * tbl;

		while (g->bl->qty >= mlen) mlen += mlen;
		tbl = (struct bstrList *) bstr__realloc (g->bl, BLE_SZ + sizeof (bstring) * mlen);
		if (tbl == NULL) return BSTR_ERR;
		g->bl = tbl;
		g->mlen = mlen;
	}

	g->bl->entry[g->bl->qty] = bmidstr (g->b, ofs, len);
	g->bl->qty++;
	return 0;
}